

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::PrintFieldDescriptorsInDescriptor
          (Generator *this,Descriptor *message_descriptor,bool is_extension,
          string *list_variable_name,offset_in_Descriptor_to_subr CountFn,
          offset_in_Descriptor_to_subr GetterFn)

{
  int iVar1;
  FieldDescriptor *field;
  code *in_stack_00000008;
  long in_stack_00000010;
  code *local_b0;
  code *local_98;
  int local_5c;
  int i;
  offset_in_Descriptor_to_subr GetterFn_local;
  offset_in_Descriptor_to_subr CountFn_local;
  string *list_variable_name_local;
  bool is_extension_local;
  Descriptor *message_descriptor_local;
  Generator *this_local;
  
  io::Printer::Print(this->printer_,"$list$=[\n","list",list_variable_name);
  io::Printer::Indent(this->printer_);
  local_5c = 0;
  while( true ) {
    local_98 = (code *)CountFn;
    if ((CountFn & 1) != 0) {
      local_98 = *(code **)(*(long *)(message_descriptor + GetterFn) + (CountFn - 1));
    }
    iVar1 = (*local_98)(message_descriptor + GetterFn);
    if (iVar1 <= local_5c) break;
    if (((ulong)in_stack_00000008 & 1) == 0) {
      local_b0 = in_stack_00000008;
    }
    else {
      local_b0 = *(code **)(in_stack_00000008 +
                           *(long *)(message_descriptor + in_stack_00000010) + -1);
    }
    field = (FieldDescriptor *)(*local_b0)(message_descriptor + in_stack_00000010,local_5c);
    PrintFieldDescriptor(this,field,is_extension);
    io::Printer::Print(this->printer_,",\n");
    local_5c = local_5c + 1;
  }
  io::Printer::Outdent(this->printer_);
  io::Printer::Print(this->printer_,"],\n");
  return;
}

Assistant:

void Generator::PrintFieldDescriptorsInDescriptor(
    const Descriptor& message_descriptor,
    bool is_extension,
    const string& list_variable_name,
    int (Descriptor::*CountFn)() const,
    const FieldDescriptor* (Descriptor::*GetterFn)(int) const) const {
  printer_->Print("$list$=[\n", "list", list_variable_name);
  printer_->Indent();
  for (int i = 0; i < (message_descriptor.*CountFn)(); ++i) {
    PrintFieldDescriptor(*(message_descriptor.*GetterFn)(i),
                         is_extension);
    printer_->Print(",\n");
  }
  printer_->Outdent();
  printer_->Print("],\n");
}